

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O0

void av1_build_nmv_component_cost_table
               (int *mvcost,nmv_component *mvcomp,MvSubpelPrecision precision)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  char in_DL;
  undefined4 *in_RDI;
  int cost_3;
  int hp_1;
  int top;
  int cost_2;
  int cost_swap_hi;
  int cost_1;
  int class_1;
  int exponent_1;
  int cost;
  int class;
  int exponent;
  int hp;
  int negate_sign;
  int cost_swap [10];
  int hp_cost [2];
  int class0_hp_cost [2];
  int fp_cost [4];
  int class0_fp_cost [2] [4];
  int bits_cost [10] [2];
  int class0_cost [2];
  int class_cost [11];
  int sign_cost [2];
  int mantissa;
  int o;
  int v;
  int j;
  int i;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int local_148;
  int local_140;
  int local_138 [12];
  int local_108 [4];
  int local_f8 [4];
  int local_e8 [8];
  int local_c8 [22];
  int local_70 [12];
  int local_40;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  char local_11;
  undefined4 *local_8;
  
  local_11 = in_DL;
  local_8 = in_RDI;
  memset(local_e8,0,0x20);
  memset(local_f8,0,0x10);
  memset(local_108 + 2,0,8);
  memset(local_108,0,8);
  av1_cost_tokens_from_cdf
            ((int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (aom_cdf_prob *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  av1_cost_tokens_from_cdf
            ((int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (aom_cdf_prob *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  av1_cost_tokens_from_cdf
            ((int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (aom_cdf_prob *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    av1_cost_tokens_from_cdf
              ((int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (aom_cdf_prob *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  if (-1 < local_11) {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      av1_cost_tokens_from_cdf
                ((int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (aom_cdf_prob *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    }
    av1_cost_tokens_from_cdf
              ((int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (aom_cdf_prob *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  if ('\0' < local_11) {
    av1_cost_tokens_from_cdf
              ((int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (aom_cdf_prob *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    av1_cost_tokens_from_cdf
              ((int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (aom_cdf_prob *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  memset(local_138,0,0x28);
  iVar1 = local_2c - local_30;
  for (local_18 = 1; local_18 < 10; local_18 = local_18 + 1) {
    local_138[local_18] = local_c8[(long)(local_18 + -1) * 2 + 1];
    if (1 < local_18) {
      local_138[local_18] = local_138[local_18] - local_70[(long)(local_18 + -1) + 2];
    }
  }
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    for (local_140 = 0; local_140 < 2; local_140 = local_140 + 1) {
      local_20 = local_24 * 2 + local_140 + 1;
      local_8[local_20] = local_f8[local_24] + local_108[local_140] + local_30;
    }
  }
  *local_8 = 0;
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    bVar3 = (byte)local_18;
    local_148 = 0;
    if (0 < local_18) {
      local_148 = local_70[(long)local_18 + 2];
    }
    local_28 = 0;
    for (local_1c = 0; local_1c <= local_18; local_1c = local_1c + 1) {
      for (; local_28 < 8 << ((byte)local_1c & 0x1f); local_28 = local_28 + 1) {
        iVar2 = local_8[local_28 + 1] + local_148 + local_138[local_1c];
        local_20 = (8 << (bVar3 & 0x1f)) + local_28 + 1;
        local_8[local_20] = iVar2;
        local_8[-local_20] = iVar2 + iVar1;
      }
      local_138[local_1c] = local_c8[(long)local_18 * 2] + local_138[local_1c];
    }
  }
  local_28 = 0;
  for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
    for (; local_28 < 8 << ((byte)local_1c & 0x1f); local_28 = local_28 + 1) {
      iVar2 = local_8[local_28 + 1] + local_40 + local_138[local_1c];
      local_20 = local_28 + 0x2001;
      local_8[local_20] = iVar2;
      local_8[-local_20] = iVar2 + iVar1;
    }
  }
  for (; local_28 < 0x1fff; local_28 = local_28 + 1) {
    iVar2 = local_8[local_28 + 1] + local_40 + (local_c8[0x13] - local_70[0xb]);
    local_20 = local_28 + 0x2001;
    local_8[local_20] = iVar2;
    local_8[-local_20] = iVar2 + iVar1;
  }
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      iVar1 = local_e8[(long)local_18 * 4 + (long)local_24] + local_70[2] + local_70[local_18];
      for (iVar2 = 0; iVar2 < 2; iVar2 = iVar2 + 1) {
        local_20 = local_18 * 8 + local_24 * 2 + iVar2 + 1;
        local_8[local_20] = iVar1 + local_108[(long)iVar2 + 2] + local_30;
        local_8[-local_20] = iVar1 + local_108[(long)iVar2 + 2] + local_2c;
      }
    }
  }
  return;
}

Assistant:

void av1_build_nmv_component_cost_table(int *mvcost,
                                        const nmv_component *const mvcomp,
                                        MvSubpelPrecision precision) {
  int i, j, v, o, mantissa;
  int sign_cost[2], class_cost[MV_CLASSES], class0_cost[CLASS0_SIZE];
  int bits_cost[MV_OFFSET_BITS][2];
  int class0_fp_cost[CLASS0_SIZE][MV_FP_SIZE] = { 0 },
      fp_cost[MV_FP_SIZE] = { 0 };
  int class0_hp_cost[2] = { 0 }, hp_cost[2] = { 0 };

  av1_cost_tokens_from_cdf(sign_cost, mvcomp->sign_cdf, NULL);
  av1_cost_tokens_from_cdf(class_cost, mvcomp->classes_cdf, NULL);
  av1_cost_tokens_from_cdf(class0_cost, mvcomp->class0_cdf, NULL);
  for (i = 0; i < MV_OFFSET_BITS; ++i) {
    av1_cost_tokens_from_cdf(bits_cost[i], mvcomp->bits_cdf[i], NULL);
  }

  if (precision > MV_SUBPEL_NONE) {
    for (i = 0; i < CLASS0_SIZE; ++i)
      av1_cost_tokens_from_cdf(class0_fp_cost[i], mvcomp->class0_fp_cdf[i],
                               NULL);
    av1_cost_tokens_from_cdf(fp_cost, mvcomp->fp_cdf, NULL);
  }

  if (precision > MV_SUBPEL_LOW_PRECISION) {
    av1_cost_tokens_from_cdf(class0_hp_cost, mvcomp->class0_hp_cdf, NULL);
    av1_cost_tokens_from_cdf(hp_cost, mvcomp->hp_cdf, NULL);
  }

  // Instead of accumulating the cost of each vector component's bits
  //   individually, compute the costs based on smaller vectors. Costs for
  //   [2^exp, 2 * 2^exp - 1] are calculated based on [0, 2^exp - 1]
  //   respectively. Offsets are maintained to swap both 1) class costs when
  //   treated as a complete vector component with the highest set bit when
  //   treated as a mantissa (significand) and 2) leading zeros to account for
  //   the current exponent.

  // Cost offsets
  int cost_swap[MV_OFFSET_BITS] = { 0 };
  // Delta to convert positive vector to negative vector costs
  int negate_sign = sign_cost[1] - sign_cost[0];

  // Initialize with offsets to swap the class costs with the costs of the
  //   highest set bit.
  for (i = 1; i < MV_OFFSET_BITS; ++i) {
    cost_swap[i] = bits_cost[i - 1][1];
    if (i > CLASS0_BITS) cost_swap[i] -= class_cost[i - CLASS0_BITS];
  }

  // Seed the fractional costs onto the output (overwritten latter).
  for (o = 0; o < MV_FP_SIZE; ++o) {
    int hp;
    for (hp = 0; hp < 2; ++hp) {
      v = 2 * o + hp + 1;
      mvcost[v] = fp_cost[o] + hp_cost[hp] + sign_cost[0];
    }
  }

  mvcost[0] = 0;
  // Fill the costs for each exponent's vectors, using the costs set in the
  //   previous exponents.
  for (i = 0; i < MV_OFFSET_BITS; ++i) {
    const int exponent = (2 * MV_FP_SIZE) << i;

    int class = 0;
    if (i >= CLASS0_BITS) {
      class = class_cost[i - CLASS0_BITS + 1];
    }

    // Iterate through mantissas, keeping track of the location
    //   of the highest set bit for the mantissa.
    // To be clear: in the outer loop, the position of the highest set bit
    //   (exponent) is tracked and, in this loop, the highest set bit of the
    //   mantissa is tracked.
    mantissa = 0;
    for (j = 0; j <= i; ++j) {
      for (; mantissa < (2 * MV_FP_SIZE) << j; ++mantissa) {
        int cost = mvcost[mantissa + 1] + class + cost_swap[j];
        v = exponent + mantissa + 1;
        mvcost[v] = cost;
        mvcost[-v] = cost + negate_sign;
      }
      cost_swap[j] += bits_cost[i][0];
    }
  }

  // Special case to avoid buffer overrun
  {
    int exponent = (2 * MV_FP_SIZE) << MV_OFFSET_BITS;
    int class = class_cost[MV_CLASSES - 1];
    mantissa = 0;
    for (j = 0; j < MV_OFFSET_BITS; ++j) {
      for (; mantissa < (2 * MV_FP_SIZE) << j; ++mantissa) {
        int cost = mvcost[mantissa + 1] + class + cost_swap[j];
        v = exponent + mantissa + 1;
        mvcost[v] = cost;
        mvcost[-v] = cost + negate_sign;
      }
    }
    // At this point: mantissa = exponent >> 1

    // Manually calculate the final cost offset
    int cost_swap_hi =
        bits_cost[MV_OFFSET_BITS - 1][1] - class_cost[MV_CLASSES - 2];
    for (; mantissa < exponent - 1; ++mantissa) {
      int cost = mvcost[mantissa + 1] + class + cost_swap_hi;
      v = exponent + mantissa + 1;
      mvcost[v] = cost;
      mvcost[-v] = cost + negate_sign;
    }
  }

  // Fill costs for class0 vectors, overwriting previous placeholder values
  //   used for calculating the costs of the larger vectors.
  for (i = 0; i < CLASS0_SIZE; ++i) {
    const int top = i * 2 * MV_FP_SIZE;
    for (o = 0; o < MV_FP_SIZE; ++o) {
      int hp;
      int cost = class0_fp_cost[i][o] + class_cost[0] + class0_cost[i];
      for (hp = 0; hp < 2; ++hp) {
        v = top + 2 * o + hp + 1;
        mvcost[v] = cost + class0_hp_cost[hp] + sign_cost[0];
        mvcost[-v] = cost + class0_hp_cost[hp] + sign_cost[1];
      }
    }
  }
}